

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::FixedRate::update
          (FixedRate *this,Array *weights,Array *bias,Array *weightSensitivity,
          Array *biasSensitivity)

{
  Array *biasSensitivity_local;
  Array *weightSensitivity_local;
  Array *bias_local;
  Array *weights_local;
  FixedRate *this_local;
  
  if ((this->momentum != 0.0) || (NAN(this->momentum))) {
    deltaRuleWithMomentum(this,weights,&this->lastDeltaW,weightSensitivity);
    deltaRuleWithMomentum(this,bias,&this->lastDeltaB,biasSensitivity);
  }
  else {
    deltaRule(this,weights,weightSensitivity);
    deltaRule(this,bias,biasSensitivity);
  }
  return;
}

Assistant:

virtual void update(Array &weights, Array &bias,
                        Array &weightSensitivity, Array &biasSensitivity) {
        if (momentum == 0.0) {
            deltaRule(weights, weightSensitivity);
            deltaRule(bias, biasSensitivity);
        } else {
            deltaRuleWithMomentum(weights, lastDeltaW, weightSensitivity);
            deltaRuleWithMomentum(bias, lastDeltaB, biasSensitivity);
        }
    }